

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O3

void compactor_get_next_filename(char *file,char *nextfile)

{
  ulong uVar1;
  char *__s;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  char str_no [24];
  stat st;
  int local_dc;
  char local_d8 [24];
  stat local_c0;
  
  local_dc = 0;
  sVar4 = strlen(file);
  uVar8 = (int)sVar4 + 1;
  uVar7 = sVar4 & 0xffffffff;
  do {
    if ((int)uVar7 < 1) goto LAB_0010f8c6;
    uVar1 = uVar7 - 1;
    uVar8 = uVar8 + 0x7fffffff;
    lVar2 = uVar7 - 1;
    uVar7 = uVar1;
  } while (file[lVar2] != '.');
  uVar7 = (ulong)((int)uVar1 + 1U & 0x7fffffff);
  __s = file + uVar7;
  sVar4 = strlen(__s);
  if ((int)(uint)sVar4 < 1) {
LAB_0010f914:
    __isoc99_sscanf(__s,"%d",&local_dc);
    strncpy(nextfile,file,uVar7);
    do {
      nextfile[uVar7] = '\0';
      local_dc = local_dc + 1;
      sprintf(local_d8,"%d");
      strcat(nextfile,local_d8);
      iVar3 = stat(nextfile,&local_c0);
    } while (iVar3 == 0);
  }
  else {
    if (0xf5 < (byte)(*__s - 0x3aU)) {
      uVar5 = (ulong)((uint)sVar4 & 0x7fffffff);
      uVar1 = 1;
      do {
        uVar6 = uVar1;
        if (uVar5 == uVar6) break;
        uVar1 = uVar6 + 1;
      } while (0xf5 < (byte)(file[uVar6 + (uVar8 & 0x7fffffff)] - 0x3aU));
      if (uVar5 <= uVar6) goto LAB_0010f914;
    }
LAB_0010f8c6:
    uVar7 = 1;
    do {
      strcpy(nextfile,file);
      sprintf(local_d8,".%d",uVar7);
      strcat(nextfile,local_d8);
      iVar3 = stat(nextfile,&local_c0);
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (iVar3 == 0);
  }
  return;
}

Assistant:

void compactor_get_next_filename(char *file, char *nextfile)
{
    int compaction_no = 0;
    int prefix_len = _compactor_prefix_len(file);
    char str_no[24];

    if (prefix_len > 0 && _allDigit(file + prefix_len)) {
        sscanf(file+prefix_len, "%d", &compaction_no);
        strncpy(nextfile, file, prefix_len);
        do {
            nextfile[prefix_len] = 0;
            sprintf(str_no, "%d", ++compaction_no);
            strcat(nextfile, str_no);
        } while (does_file_exist(nextfile));
    } else {
        do {
            strcpy(nextfile, file);
            sprintf(str_no, ".%d", ++compaction_no);
            strcat(nextfile, str_no);
        } while (does_file_exist(nextfile));
    }
}